

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_get_intra_cost_penalty(int qindex,int qdelta,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int in_EDX;
  int q;
  aom_bit_depth_t in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  iVar1 = av1_dc_quant_QTX(in_EDX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  local_4 = (int)iVar1;
  if (in_EDX == 8) {
    local_4 = local_4 * 0x14;
  }
  else if (in_EDX == 10) {
    local_4 = local_4 * 5;
  }
  else if (in_EDX == 0xc) {
    local_4 = local_4 * 5 + 2 >> 2;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int av1_get_intra_cost_penalty(int qindex, int qdelta,
                               aom_bit_depth_t bit_depth) {
  const int q = av1_dc_quant_QTX(qindex, qdelta, bit_depth);
  switch (bit_depth) {
    case AOM_BITS_8: return 20 * q;
    case AOM_BITS_10: return 5 * q;
    case AOM_BITS_12: return ROUND_POWER_OF_TWO(5 * q, 2);
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
}